

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  bool bVar1;
  iterator iVar2;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  FileDescriptor *file_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string header_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  bVar1 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar1) {
    if (this->include_wkt_imports_ != true) {
      return;
    }
    FilePathBasename_abi_cxx11_(&local_60,(objectivec *)file,file_00);
    std::operator+(&local_80,"GPB",&local_60);
    std::operator+(&local_a0,&local_80,header_extension);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->protobuf_imports_,&local_a0);
    this_00 = &local_a0;
  }
  else {
    if (this->need_to_parse_mapping_file_ == true) {
      ParseFrameworkMappings(this);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->proto_file_to_framework_name_)._M_t,*(key_type **)file);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header) {
      if ((this->generate_for_named_framework_)._M_string_length == 0) {
        FilePath_abi_cxx11_(&local_80,(objectivec *)file,file_01);
        std::operator+(&local_a0,&local_80,header_extension);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->other_imports_,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        this_00 = &local_80;
        goto LAB_002b1269;
      }
      std::operator+(&local_60,&this->generate_for_named_framework_,"/");
      FilePathBasename_abi_cxx11_(&local_40,(objectivec *)file,file_03);
      std::operator+(&local_80,&local_60,&local_40);
      std::operator+(&local_a0,&local_80,header_extension);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_a0);
    }
    else {
      std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (iVar2._M_node + 2),"/");
      FilePathBasename_abi_cxx11_(&local_40,(objectivec *)file,file_02);
      std::operator+(&local_80,&local_60,&local_40);
      std::operator+(&local_a0,&local_80,header_extension);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,&local_a0);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
  }
LAB_002b1269:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (include_wkt_imports_) {
      const std::string header_name =
          "GPB" + FilePathBasename(file) + header_extension;
      protobuf_imports_.push_back(header_name);
    }
    return;
  }

  // Lazy parse any mappings.
  if (need_to_parse_mapping_file_) {
    ParseFrameworkMappings();
  }

  std::map<std::string, std::string>::iterator proto_lookup =
      proto_file_to_framework_name_.find(file->name());
  if (proto_lookup != proto_file_to_framework_name_.end()) {
    other_framework_imports_.push_back(
        proto_lookup->second + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        generate_for_named_framework_ + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}